

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.h
# Opt level: O0

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::TPZSkylNSymMatrix
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZSkylNSymMatrix<std::complex<float>_> *A)

{
  TPZRegisterClassId *in_RDI;
  TPZSkylNSymMatrix<std::complex<float>_> *in_stack_00000008;
  TPZSkylNSymMatrix<std::complex<float>_> *in_stack_00000010;
  int64_t in_stack_ffffffffffffffa8;
  TPZVec<std::complex<float>_*> *in_stack_ffffffffffffffb0;
  void **in_stack_ffffffffffffffb8;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSkylNSymMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_RDI,in_stack_ffffffffffffffb8,
             (TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffffb0);
  *(undefined ***)in_RDI = &PTR__TPZSkylNSymMatrix_0242cf38;
  TPZVec<std::complex<float>_*>::TPZVec(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZVec<std::complex<float>_*>::TPZVec(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZManVector<std::complex<float>,_10>::TPZManVector
            ((TPZManVector<std::complex<float>,_10> *)in_stack_00000010,(int64_t)in_stack_00000008);
  TPZManVector<std::complex<float>,_10>::TPZManVector
            ((TPZManVector<std::complex<float>,_10> *)in_stack_00000010,(int64_t)in_stack_00000008);
  Copy(in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

TPZSkylNSymMatrix(const TPZSkylNSymMatrix &A ) : 
    TPZRegisterClassId(&TPZSkylNSymMatrix::ClassId),TPZMatrix<TVar>(A), fElem(0), fElemb(0), fStorage(0), fStorageb(0)  
    { 
        Copy(A); 
    }